

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5HeapArgumentsObject::IsEnumerableByIndex(ES5HeapArgumentsObject *this,uint32 index)

{
  ScriptContext *scriptContext;
  int iVar1;
  PropertyRecord *in_RAX;
  Var aValue;
  JavascriptString *propertyString;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  scriptContext =
       (((((this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_28 = in_RAX;
  aValue = JavascriptNumber::ToVar((double)index);
  propertyString = JavascriptConversion::ToString(aValue,scriptContext);
  ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_28);
  iVar1 = (*(this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x32])(this,(ulong)(uint)local_28->pid);
  return iVar1;
}

Assistant:

BOOL ES5HeapArgumentsObject::IsEnumerableByIndex(uint32 index)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        Var indexNumber = JavascriptNumber::New(index, scriptContext);
        JavascriptString* indexPropertyName = JavascriptConversion::ToString(indexNumber, scriptContext);
        PropertyRecord const * propertyRecord;
        scriptContext->GetOrAddPropertyRecord(indexPropertyName, &propertyRecord);
        return this->IsEnumerable(propertyRecord->GetPropertyId());
    }